

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_create.c
# Opt level: O0

int mbedtls_x509_write_extensions(uchar **p,uchar *start,mbedtls_asn1_named_data *first)

{
  int iVar1;
  mbedtls_asn1_named_data *local_40;
  mbedtls_asn1_named_data *cur_ext;
  size_t len;
  int ret;
  mbedtls_asn1_named_data *first_local;
  uchar *start_local;
  uchar **p_local;
  
  cur_ext = (mbedtls_asn1_named_data *)0x0;
  local_40 = first;
  while( true ) {
    if (local_40 == (mbedtls_asn1_named_data *)0x0) {
      return (int)cur_ext;
    }
    iVar1 = x509_write_extension(p,start,local_40);
    if (iVar1 < 0) break;
    cur_ext = (mbedtls_asn1_named_data *)((long)&(cur_ext->oid).tag + (long)iVar1);
    local_40 = local_40->next;
  }
  return iVar1;
}

Assistant:

int mbedtls_x509_write_extensions( unsigned char **p, unsigned char *start,
                           mbedtls_asn1_named_data *first )
{
    int ret;
    size_t len = 0;
    mbedtls_asn1_named_data *cur_ext = first;

    while( cur_ext != NULL )
    {
        MBEDTLS_ASN1_CHK_ADD( len, x509_write_extension( p, start, cur_ext ) );
        cur_ext = cur_ext->next;
    }

    return( (int) len );
}